

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestSpec::TagPattern::~TagPattern(TagPattern *this)

{
  ~TagPattern(this);
  operator_delete(this);
  return;
}

Assistant:

TestSpec::TagPattern::~TagPattern() {}